

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall am_CList::Validate(am_CList *this,Am_Slot *validating_slot)

{
  byte bVar1;
  byte local_31;
  undefined1 local_30 [7];
  bool changed;
  Am_Value value;
  CItem *curr;
  Am_Slot *validating_slot_local;
  am_CList *this_local;
  
  Am_Value::Am_Value((Am_Value *)local_30);
  while (this->head != (CItem *)0x0) {
    value.value = (anon_union_8_8_ea4c8939_for_value)this->head;
    this->head = (CItem *)this->head->field_1;
    ((anon_union_8_2_a7014589_for_CItem_2 *)&(value.value.method_value)->Call)->prev = (CItem *)0x0;
    local_31 = 0;
    bVar1 = (**(code **)(**value.value.voidptr_value + 0x28))
                      (*value.value.voidptr_value,validating_slot,local_30,&local_31);
    if (((bVar1 & 1) != 0) && ((local_31 & 1) != 0)) {
      local_30._0_2_ = 0x1002;
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void
am_CList::Validate(const Am_Slot &validating_slot)
{
  CItem *curr;
  Am_Value value;
  while (head) {
    curr = head;
    head = head->next_invalid;
    curr->next_invalid = nullptr;
    bool changed = false;
    if (curr->value->Get(validating_slot, value, changed) && changed)
      value.type = Am_MISSING_SLOT;
  }
}